

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_stvewx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t reg;
  TCGv_i64 EA_00;
  TCGv_ptr arg2;
  TCGv_ptr rs;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->altivec_enabled ^ 0xffU) & 1) == 0) {
    gen_set_access_type(ctx,0x20);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,EA_00,EA_00,-4);
    reg = rS(ctx->opcode);
    arg2 = gen_avr_ptr(tcg_ctx_00,reg);
    gen_helper_stvewx(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
  }
  else {
    gen_exception(ctx,0x49);
  }
  return;
}

Assistant:

static void gen_mfvscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t;
    TCGv_i64 avr;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    avr = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_movi_i64(tcg_ctx, avr, 0);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, true);
    t = tcg_temp_new_i32(tcg_ctx);
    gen_helper_mfvscr(tcg_ctx, t, tcg_ctx->cpu_env);
    tcg_gen_extu_i32_i64(tcg_ctx, avr, t);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, false);
    tcg_temp_free_i32(tcg_ctx, t);
    tcg_temp_free_i64(tcg_ctx, avr);
}